

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

int apply_chat_template_with_error_handling
              (common_chat_templates *tmpls,LlamaData *llama_data,bool append,int *output_length,
              bool use_jinja)

{
  int iVar1;
  int *in_RCX;
  int new_len;
  bool in_stack_00000226;
  bool in_stack_00000227;
  LlamaData *in_stack_00000228;
  common_chat_templates *in_stack_00000230;
  int local_4;
  
  iVar1 = apply_chat_template(in_stack_00000230,in_stack_00000228,in_stack_00000227,
                              in_stack_00000226);
  if (iVar1 < 0) {
    printe("failed to apply the chat template\n");
    local_4 = -1;
  }
  else {
    *in_RCX = iVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int apply_chat_template_with_error_handling(const common_chat_templates * tmpls, LlamaData & llama_data, const bool append, int & output_length, bool use_jinja) {
    const int new_len = apply_chat_template(tmpls, llama_data, append, use_jinja);
    if (new_len < 0) {
        printe("failed to apply the chat template\n");
        return -1;
    }

    output_length = new_len;
    return 0;
}